

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O1

string * NetwTimeString_abi_cxx11_(string *__return_storage_ptr__,float runS)

{
  size_t sVar1;
  float fVar2;
  char s [20];
  char acStack_28 [24];
  
  fVar2 = runS - (float)((long)(runS / 3600.0) & 0xffffffff) * 3600.0;
  snprintf(acStack_28,0x14,"%u:%02u:%06.3f",
           (double)(fVar2 - (float)((long)(fVar2 / 60.0) & 0xffffffff) * 60.0));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_28);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_28,acStack_28 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string NetwTimeString (float runS)
{
    // Extract hours, minutes, and seconds (incl. fractions) from runS
    const unsigned runH = unsigned(runS / 3600.0f);
    runS -= runH * 3600.0f;
    const unsigned runM = unsigned(runS / 60.0f);
    runS -= runM * 60.0f;

    // Convert to string
    char s[20];
    snprintf(s, sizeof(s), "%u:%02u:%06.3f",
             runH, runM, runS);
    return std::string(s);
}